

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationInternallySynchronizedObjectsTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::synchronization::anon_unknown_0::CreateGraphicThread::runThread
          (TestStatus *__return_storage_ptr__,CreateGraphicThread *this)

{
  pointer pVVar1;
  pointer pVVar2;
  qpTestResult qVar3;
  DeviceInterface *vk;
  ulong uVar4;
  int iVar5;
  TestStatus result;
  ResultCollector resultCollector;
  Move<vk::Handle<(vk::HandleType)18>_> pipeline;
  
  tcu::ResultCollector::ResultCollector(&resultCollector);
  for (iVar5 = 0; iVar5 != 100; iVar5 = iVar5 + 1) {
    pVVar1 = (this->m_pipelineInfo->
             super__Vector_base<vk::VkGraphicsPipelineCreateInfo,_std::allocator<vk::VkGraphicsPipelineCreateInfo>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pVVar2 = (this->m_pipelineInfo->
             super__Vector_base<vk::VkGraphicsPipelineCreateInfo,_std::allocator<vk::VkGraphicsPipelineCreateInfo>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    vk = Context::getDeviceInterface((this->super_ThreadGroupThread).m_context);
    uVar4 = (long)iVar5 % (long)(int)(((long)pVVar2 - (long)pVVar1) / 0x90) & 0xffffffff;
    ::vk::createGraphicsPipeline
              ((Move<vk::Handle<(vk::HandleType)18>_> *)
               &pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>,vk,
               (((this->super_ThreadGroupThread).m_queues)->m_logicalDevice).
               super_RefBase<vk::VkDevice_s_*>.m_data.object,
               (VkPipelineCache)(this->super_ThreadGroupThread).m_pipelineCache.m_internal,
               (this->m_pipelineInfo->
               super__Vector_base<vk::VkGraphicsPipelineCreateInfo,_std::allocator<vk::VkGraphicsPipelineCreateInfo>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar4,(VkAllocationCallbacks *)0x0);
    executeGraphicPipeline
              (&result,(this->super_ThreadGroupThread).m_context,
               (VkPipeline *)&pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>,
               (this->super_ThreadGroupThread).m_pipelineLayout,
               (this->super_ThreadGroupThread).m_descriptorSetLayout,
               (this->super_ThreadGroupThread).m_queues,this->m_renderPass,
               (((this->super_ThreadGroupThread).m_shadersExecutions)->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar4]);
    tcu::ResultCollector::addResult(&resultCollector,result.m_code,&result.m_description);
    std::__cxx11::string::~string((string *)&result.m_description);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
              (&pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  }
  qVar3 = tcu::ResultCollector::getResult(&resultCollector);
  std::__cxx11::string::string((string *)&result,(string *)&resultCollector.m_message);
  __return_storage_ptr__->m_code = qVar3;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->m_description,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  tcu::ResultCollector::~ResultCollector(&resultCollector);
  return __return_storage_ptr__;
}

Assistant:

TestStatus	runThread		(void)
	{
		ResultCollector		resultCollector;
		for (int executionNdx = 0; executionNdx < EXECUTION_PER_THREAD; ++executionNdx)
		{
			const int shaderNdx					= executionNdx % (int)m_pipelineInfo.size();
			const DeviceInterface&	vk			= m_context.getDeviceInterface();
			const VkDevice			device		= m_queues.getDevice();
			Move<VkPipeline>		pipeline	= createGraphicsPipeline(vk,device, m_pipelineCache, &m_pipelineInfo[shaderNdx]);

			TestStatus result = executeGraphicPipeline(m_context, *pipeline, m_pipelineLayout, m_descriptorSetLayout, m_queues, m_renderPass, m_shadersExecutions[shaderNdx]);
			resultCollector.addResult(result.getCode(), result.getDescription());
		}
		return TestStatus(resultCollector.getResult(), resultCollector.getMessage());
	}